

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O1

void __thiscall
asio::detail::epoll_reactor::
add_timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue)

{
  pthread_mutex_t *__mutex;
  
  if ((char)(this->interrupter_).read_descriptor_ == '\x01') {
    __mutex = (pthread_mutex_t *)((long)&(this->mutex_).mutex_.mutex_ + 8);
    pthread_mutex_lock(__mutex);
    (queue->super_timer_queue_base).next_ = *(timer_queue_base **)&this->shutdown_;
    *(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
      **)&this->shutdown_ = queue;
    pthread_mutex_unlock(__mutex);
    return;
  }
  (queue->super_timer_queue_base).next_ = *(timer_queue_base **)&this->shutdown_;
  *(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
    **)&this->shutdown_ = queue;
  return;
}

Assistant:

void epoll_reactor::add_timer_queue(timer_queue<Time_Traits>& queue)
{
  do_add_timer_queue(queue);
}